

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall google::FlagSaverImpl::SaveFromRegistry(FlagSaverImpl *this)

{
  bool bVar1;
  pointer ppVar2;
  CommandLineFlag *this_00;
  char *name;
  char *help;
  char *filename;
  FlagValue *current_val;
  FlagValue *default_val;
  CommandLineFlag *local_48;
  CommandLineFlag *backup;
  CommandLineFlag *main;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
  local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
  local_20;
  FlagConstIterator it;
  FlagRegistryLock frl;
  FlagSaverImpl *this_local;
  
  anon_unknown_1::FlagRegistryLock::FlagRegistryLock((FlagRegistryLock *)&it,this->main_registry_);
  bVar1 = std::
          vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
          ::empty(&this->backup_registry_);
  if (!bVar1) {
    __assert_fail("backup_registry_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                  ,0x678,"void google::FlagSaverImpl::SaveFromRegistry()");
  }
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_google::(anonymous_namespace)::CommandLineFlag_*,_google::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
       ::begin(&this->main_registry_->flags_);
  std::
  _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
  ::_Rb_tree_const_iterator(&local_20,&local_28);
  while( true ) {
    main = (CommandLineFlag *)
           std::
           map<const_char_*,_google::(anonymous_namespace)::CommandLineFlag_*,_google::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
           ::end(&this->main_registry_->flags_);
    std::
    _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
    ::_Rb_tree_const_iterator(&local_30,(iterator *)&main);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
             ::operator->(&local_20);
    backup = ppVar2->second;
    this_00 = (CommandLineFlag *)operator_new(0x38);
    name = anon_unknown_1::CommandLineFlag::name(backup);
    help = anon_unknown_1::CommandLineFlag::help(backup);
    filename = anon_unknown_1::CommandLineFlag::filename(backup);
    current_val = anon_unknown_1::FlagValue::New(backup->current_);
    default_val = anon_unknown_1::FlagValue::New(backup->defvalue_);
    anon_unknown_1::CommandLineFlag::CommandLineFlag
              (this_00,name,help,filename,current_val,default_val);
    local_48 = this_00;
    anon_unknown_1::CommandLineFlag::CopyFrom(this_00,backup);
    std::
    vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
    ::push_back(&this->backup_registry_,&local_48);
    std::
    _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
    ::operator++(&local_20);
  }
  anon_unknown_1::FlagRegistryLock::~FlagRegistryLock((FlagRegistryLock *)&it);
  return;
}

Assistant:

void SaveFromRegistry() {
    FlagRegistryLock frl(main_registry_);
    assert(backup_registry_.empty());   // call only once!
    for (FlagRegistry::FlagConstIterator it = main_registry_->flags_.begin();
         it != main_registry_->flags_.end();
         ++it) {
      const CommandLineFlag* main = it->second;
      // Sets up all the const variables in backup correctly
      CommandLineFlag* backup = new CommandLineFlag(
          main->name(), main->help(), main->filename(),
          main->current_->New(), main->defvalue_->New());
      // Sets up all the non-const variables in backup correctly
      backup->CopyFrom(*main);
      backup_registry_.push_back(backup);   // add it to a convenient list
    }
  }